

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

void luaO_arith(lua_State *L,int op,TValue *p1,TValue *p2,TValue *res)

{
  int iVar1;
  lua_Integer lVar2;
  lua_Number lVar3;
  TValue *io_3;
  TValue *io_2;
  lua_Number n2_1;
  lua_Number n1_1;
  TValue *io_1;
  lua_Number n2;
  lua_Number n1;
  TValue *io;
  lua_Integer i2;
  lua_Integer i1;
  TValue *res_local;
  TValue *p2_local;
  TValue *p1_local;
  lua_State *plStack_10;
  int op_local;
  lua_State *L_local;
  
  i1 = (lua_Integer)res;
  res_local = p2;
  p2_local = p1;
  p1_local._4_4_ = op;
  plStack_10 = L;
  if (op - 4U < 2) {
    if (p1->tt_ == 3) {
      n2 = (p1->value_).n;
    }
    else {
      iVar1 = luaV_tonumber_(p1,&n2);
      if (iVar1 == 0) goto LAB_001184ce;
    }
    if (res_local->tt_ == 3) {
      io_1 = (TValue *)(res_local->value_).gc;
    }
    else {
      iVar1 = luaV_tonumber_(res_local,(lua_Number *)&io_1);
      if (iVar1 == 0) goto LAB_001184ce;
    }
    n1_1 = (lua_Number)i1;
    lVar3 = numarith(plStack_10,p1_local._4_4_,n2,(lua_Number)io_1);
    *(lua_Number *)n1_1 = lVar3;
    *(undefined4 *)((long)n1_1 + 8) = 3;
    return;
  }
  if ((op - 7U < 5) || (op == 0xd)) {
    if (p1->tt_ == 0x13) {
      i2 = (p1->value_).i;
    }
    else {
      iVar1 = luaV_tointeger(p1,&i2,0);
      if (iVar1 == 0) goto LAB_001184ce;
    }
    if (res_local->tt_ == 0x13) {
      io = (TValue *)(res_local->value_).gc;
    }
    else {
      iVar1 = luaV_tointeger(res_local,(lua_Integer *)&io,0);
      if (iVar1 == 0) goto LAB_001184ce;
    }
    n1 = (lua_Number)i1;
    lVar2 = intarith(plStack_10,p1_local._4_4_,i2,(lua_Integer)io);
    *(lua_Integer *)n1 = lVar2;
    *(undefined4 *)((long)n1 + 8) = 0x13;
    return;
  }
  if ((p1->tt_ == 0x13) && (p2->tt_ == 0x13)) {
    lVar2 = intarith(L,op,(p1->value_).i,(p2->value_).i);
    (res->value_).i = lVar2;
    res->tt_ = 0x13;
    return;
  }
  if (p1->tt_ == 3) {
    n2_1 = (p1->value_).n;
  }
  else {
    iVar1 = luaV_tonumber_(p1,&n2_1);
    if (iVar1 == 0) goto LAB_001184ce;
  }
  if (res_local->tt_ == 3) {
    io_2 = (TValue *)(res_local->value_).gc;
  }
  else {
    iVar1 = luaV_tonumber_(res_local,(lua_Number *)&io_2);
    if (iVar1 == 0) {
LAB_001184ce:
      luaT_trybinTM(plStack_10,p2_local,res_local,(StkId)i1,p1_local._4_4_ + TM_ADD);
      return;
    }
  }
  lVar2 = i1;
  lVar3 = numarith(plStack_10,p1_local._4_4_,n2_1,(lua_Number)io_2);
  *(lua_Number *)lVar2 = lVar3;
  *(undefined4 *)(lVar2 + 8) = 3;
  return;
}

Assistant:

void luaO_arith(lua_State *L, int op, const TValue *p1, const TValue *p2,
                TValue *res) {
    switch (op) {
        case LUA_OPBAND:
        case LUA_OPBOR:
        case LUA_OPBXOR:
        case LUA_OPSHL:
        case LUA_OPSHR:
        case LUA_OPBNOT: {  /* operate only on integers */
            lua_Integer i1;
            lua_Integer i2;
            if (tointeger(p1, &i1) && tointeger(p2, &i2)) {
                setivalue(res, intarith(L, op, i1, i2));
                return;
            } else break;  /* go to the end */
        }
        case LUA_OPDIV:
        case LUA_OPPOW: {  /* operate only on floats */
            lua_Number n1;
            lua_Number n2;
            if (tonumber(p1, &n1) && tonumber(p2, &n2)) {
                setfltvalue(res, numarith(L, op, n1, n2));
                return;
            } else break;  /* go to the end */
        }
        default: {  /* other operations */
            lua_Number n1;
            lua_Number n2;
            if (ttisinteger(p1) && ttisinteger(p2)) {
                setivalue(res, intarith(L, op, ivalue(p1), ivalue(p2)));
                return;
            } else if (tonumber(p1, &n1) && tonumber(p2, &n2)) {
                setfltvalue(res, numarith(L, op, n1, n2));
                return;
            } else break;  /* go to the end */
        }
    }
    /* could not perform raw operation; try metamethod */
    lua_assert(L != NULL);  /* should not fail when folding (compile time) */
    luaT_trybinTM(L, p1, p2, res, cast(TMS, (op - LUA_OPADD) + TM_ADD));
}